

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_storage.c
# Opt level: O3

psa_status_t
psa_save_persistent_key(psa_core_key_attributes_t *attr,uint8_t *data,size_t data_length)

{
  size_t __size;
  psa_status_t pVar1;
  psa_storage_info_t in_RAX;
  uint8_t *storage_data;
  psa_status_t pVar2;
  psa_storage_uid_t data_identifier;
  ulong uid;
  psa_storage_info_t data_identifier_info;
  psa_storage_info_t local_38;
  
  pVar2 = -0x8e;
  if (data_length < 0x2000) {
    __size = data_length + 0x24;
    local_38 = in_RAX;
    storage_data = (uint8_t *)calloc(1,__size);
    if (storage_data == (uint8_t *)0x0) {
      pVar2 = -0x8d;
    }
    else {
      psa_format_key_data_for_storage(data,data_length,attr,storage_data);
      uid = (ulong)attr->id;
      pVar1 = psa_its_get_info(uid,&local_38);
      pVar2 = -0x8b;
      if (pVar1 == -0x8c) {
        pVar1 = psa_its_set(uid,(uint32_t)__size,storage_data,0);
        pVar2 = -0x92;
        if (pVar1 == 0) {
          pVar1 = psa_its_get_info(uid,&local_38);
          pVar2 = 0;
          if (pVar1 != 0 || __size != ((ulong)local_38 & 0xffffffff)) {
            pVar2 = -0x92;
            if (__size == ((ulong)local_38 & 0xffffffff)) {
              pVar2 = 0;
            }
            if (pVar1 != 0) {
              pVar2 = pVar1;
            }
            psa_its_remove(uid);
          }
        }
      }
      free(storage_data);
    }
  }
  return pVar2;
}

Assistant:

psa_status_t psa_save_persistent_key( const psa_core_key_attributes_t *attr,
                                      const uint8_t *data,
                                      const size_t data_length )
{
    size_t storage_data_length;
    uint8_t *storage_data;
    psa_status_t status;

    if( data_length > PSA_CRYPTO_MAX_STORAGE_SIZE )
        return PSA_ERROR_INSUFFICIENT_STORAGE;
    storage_data_length = data_length + sizeof( psa_persistent_key_storage_format );

    storage_data = mbedtls_calloc( 1, storage_data_length );
    if( storage_data == NULL )
        return( PSA_ERROR_INSUFFICIENT_MEMORY );

    psa_format_key_data_for_storage( data, data_length, attr, storage_data );

    status = psa_crypto_storage_store( attr->id,
                                       storage_data, storage_data_length );

    mbedtls_free( storage_data );

    return( status );
}